

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

void __thiscall
duckdb::QuantileSortTree::QuantileSortTree
          (QuantileSortTree *this,AggregateInputData *aggr_input_data,
          WindowPartitionInput *partition)

{
  ulong uVar1;
  OrderType OVar2;
  FunctionData *pFVar3;
  ClientContext *context;
  idx_t iVar4;
  _Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_> _Var5;
  ValidityMask *pVVar6;
  byte *pbVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  WindowPartitionInput *pWVar10;
  bool bVar11;
  reference other;
  BoundConstantExpression *this_00;
  _Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_> this_01
  ;
  pointer pWVar12;
  WindowMergeSortTreeLocalState *this_02;
  reference vector;
  InternalException *this_03;
  pointer *__ptr;
  ulong uVar13;
  idx_t filtered;
  vector<unsigned_long,_true> sort_idx;
  SelectionVector filter_sel;
  BoundOrderModifier order_bys;
  DataChunk sort;
  ColumnDataScanState scan;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1f0;
  vector<duckdb::LogicalType,_true> local_1e8;
  ColumnDataCollection *local_1d0;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_1c8;
  WindowPartitionInput *local_1c0;
  Value local_1b8;
  SelectionVector local_178;
  LogicalType local_160;
  vector<unsigned_long,_true> local_148;
  Value local_130;
  DataChunk local_f0;
  ColumnDataScanState local_b0;
  
  (this->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)0x0;
  local_1d0 = partition->inputs;
  local_b0.current_chunk_state.handles._M_h._M_buckets =
       &local_b0.current_chunk_state.handles._M_h._M_single_bucket;
  local_b0.current_chunk_state.handles._M_h._M_bucket_count = 1;
  local_b0.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.current_chunk_state.handles._M_h._M_element_count = 0;
  local_b0.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.current_chunk_state.properties = INVALID;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataChunk::DataChunk(&local_f0);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148,
             &(partition->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::InitializeScan(local_1d0,&local_b0,&local_148,ALLOW_ZERO_COPY);
  if (local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ColumnDataCollection::InitializeScanChunk(local_1d0,&local_b0,&local_f0);
  local_1c0 = partition;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  pFVar3 = (aggr_input_data->bind_data).ptr;
  DataChunk::GetTypes(&local_1e8,&local_f0);
  other = vector<duckdb::LogicalType,_true>::operator[](&local_1e8,0);
  LogicalType::LogicalType(&local_160,other);
  Value::Value(&local_1b8,&local_160);
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_130,&local_1b8);
  BoundConstantExpression::BoundConstantExpression(this_00,&local_130);
  Value::~Value(&local_130);
  Value::~Value(&local_1b8);
  LogicalType::~LogicalType(&local_160);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1e8);
  OVar2 = *(OrderType *)&pFVar3[7]._vptr_FunctionData;
  BoundOrderModifier::BoundOrderModifier((BoundOrderModifier *)&local_130);
  local_1f0._M_head_impl = (Expression *)this_00;
  BoundOrderByNode::BoundOrderByNode
            ((BoundOrderByNode *)&local_1b8,OVar2 | ASCENDING,NULLS_LAST,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_1f0);
  pWVar10 = local_1c0;
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
             ((long)&local_130 + 0x10),(BoundOrderByNode *)&local_1b8);
  if ((BaseStatistics *)
      local_1b8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_1b8.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    operator_delete(local_1b8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  }
  local_1b8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_1b8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
    (*(local_1b8.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ExtraTypeInfo[1])();
  }
  local_1b8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  if ((BoundConstantExpression *)local_1f0._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_1f0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_1f0._M_head_impl = (Expression *)0x0;
  local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)&(local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start)->type_info_;
  (local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
   super__Vector_impl_data._M_start)->id_ = INVALID;
  (local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
   super__Vector_impl_data._M_start)->physical_type_ = ~INVALID;
  *(undefined6 *)
   &(local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
     super__Vector_impl_data._M_start)->field_0x2 = 0;
  context = pWVar10->context;
  iVar4 = pWVar10->count;
  local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this_01.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)operator_new(0xc0);
  WindowIndexTree::WindowIndexTree
            ((WindowIndexTree *)
             this_01.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl,context,
             (BoundOrderModifier *)&local_130,(vector<unsigned_long,_true> *)&local_1e8,iVar4);
  _Var5.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl =
       (this->index_tree).
       super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
       .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>;
  (this->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       this_01.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl;
  if (_Var5.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl !=
      (WindowIndexTree *)0x0) {
    (**(code **)(*(long *)_Var5.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl
                + 8))();
  }
  pWVar12 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
            ::operator->(&this->index_tree);
  (*(pWVar12->super_WindowMergeSortTree)._vptr_WindowMergeSortTree[2])(&local_1c8,pWVar12);
  this_02 = (WindowMergeSortTreeLocalState *)
            unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
            ::operator->((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                          *)&local_1c8);
  pVVar6 = pWVar10->filter_mask;
  SelectionVector::SelectionVector(&local_178,0x800);
  do {
    while( true ) {
      bVar11 = ColumnDataCollection::Scan(local_1d0,&local_b0,&local_f0);
      iVar4 = local_b0.current_row_index;
      if (!bVar11) {
        WindowMergeSortTreeLocalState::Sort(this_02);
        if (local_178.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1c8._M_head_impl != (WindowAggregatorState *)0x0) {
          (*(local_1c8._M_head_impl)->_vptr_WindowAggregatorState[1])();
        }
        if (local_1e8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_130.type_._0_8_ = &PTR__BoundOrderModifier_0197fa70;
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   ((long)&local_130 + 0x10));
        BoundResultModifier::~BoundResultModifier((BoundResultModifier *)&local_130);
        DataChunk::~DataChunk(&local_f0);
        if (local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.column_ids.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_b0);
        return;
      }
      if ((pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
         ) break;
LAB_00df9f61:
      vector = vector<duckdb::Vector,_true>::operator[](&local_f0.data,0);
      FlatVector::VerifyFlatVector(vector);
      if (local_f0.count == 0) {
        filtered = 0;
      }
      else {
        puVar8 = (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        puVar9 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar13 = 0;
        filtered = 0;
        do {
          if (((puVar8 == (unsigned_long *)0x0) ||
              (uVar1 = iVar4 + uVar13, (puVar8[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0)) &&
             ((puVar9 == (unsigned_long *)0x0 || ((puVar9[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)
              ))) {
            local_178.sel_vector[filtered] = (sel_t)uVar13;
            filtered = filtered + 1;
          }
          uVar13 = uVar13 + 1;
        } while ((uVar13 & 0xffffffff) < local_f0.count);
      }
      WindowMergeSortTreeLocalState::SinkChunk(this_02,&local_f0,iVar4,&local_178,filtered);
    }
    pbVar7 = (byte *)(local_1c0->all_valid).super_vector<bool,_std::allocator<bool>_>.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p;
    if (((long)(local_1c0->all_valid).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p - (long)pbVar7) * 8 +
        (ulong)(local_1c0->all_valid).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_offset == 0) {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_1b8.type_._0_8_ =
           &local_1b8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"Attempted to access index %ld within vector of size %ld","");
      InternalException::InternalException<unsigned_long,unsigned_long>
                (this_03,(string *)&local_1b8,0,0);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((*pbVar7 & 1) == 0) goto LAB_00df9f61;
    WindowMergeSortTreeLocalState::SinkChunk
              (this_02,&local_f0,local_b0.current_row_index,
               (optional_ptr<duckdb::SelectionVector,_true>)0x0,0);
  } while( true );
}

Assistant:

QuantileSortTree(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition) {
		// TODO: Two pass parallel sorting using Build
		auto &inputs = *partition.inputs;
		ColumnDataScanState scan;
		DataChunk sort;
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, sort);

		// Sort on the single argument
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();
		auto order_expr = make_uniq<BoundConstantExpression>(Value(sort.GetTypes()[0]));
		auto order_type = bind_data.desc ? OrderType::DESCENDING : OrderType::ASCENDING;
		BoundOrderModifier order_bys;
		order_bys.orders.emplace_back(BoundOrderByNode(order_type, OrderByNullType::NULLS_LAST, std::move(order_expr)));
		vector<column_t> sort_idx(1, 0);
		const auto count = partition.count;

		index_tree = make_uniq<WindowIndexTree>(partition.context, order_bys, sort_idx, count);
		auto index_state = index_tree->GetLocalState();
		auto &local_state = index_state->Cast<WindowIndexTreeLocalState>();

		//	Build the indirection array by scanning the valid indices
		const auto &filter_mask = partition.filter_mask;
		SelectionVector filter_sel(STANDARD_VECTOR_SIZE);
		while (inputs.Scan(scan, sort)) {
			const auto row_idx = scan.current_row_index;
			if (!filter_mask.AllValid() || !partition.all_valid[0]) {
				auto &key = sort.data[0];
				auto &validity = FlatVector::Validity(key);
				idx_t filtered = 0;
				for (sel_t i = 0; i < sort.size(); ++i) {
					if (filter_mask.RowIsValid(i + row_idx) && validity.RowIsValid(i)) {
						filter_sel[filtered++] = i;
					}
				}
				local_state.SinkChunk(sort, row_idx, filter_sel, filtered);
			} else {
				local_state.SinkChunk(sort, row_idx, nullptr, 0);
			}
		}
		local_state.Sort();
	}